

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

int64_t gguf_remove_key(gguf_context *ctx,char *key)

{
  int64_t iVar1;
  __normal_iterator<const_gguf_kv_*,_std::vector<gguf_kv,_std::allocator<gguf_kv>_>_> *this;
  iterator this_00;
  __normal_iterator<gguf_kv_*,_std::vector<gguf_kv,_std::allocator<gguf_kv>_>_> __position;
  long in_RDI;
  int64_t key_id;
  vector<gguf_kv,_std::allocator<gguf_kv>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<gguf_kv_*,_std::vector<gguf_kv,_std::allocator<gguf_kv>_>_>
  *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  gguf_context *in_stack_ffffffffffffffe0;
  
  iVar1 = gguf_find_key(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (-1 < iVar1) {
    this = (__normal_iterator<const_gguf_kv_*,_std::vector<gguf_kv,_std::allocator<gguf_kv>_>_> *)
           (in_RDI + 8);
    this_00 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::begin(in_stack_ffffffffffffffb8);
    __position = __gnu_cxx::
                 __normal_iterator<gguf_kv_*,_std::vector<gguf_kv,_std::allocator<gguf_kv>_>_>::
                 operator+(in_stack_ffffffffffffffc8,(difference_type)this);
    __gnu_cxx::__normal_iterator<gguf_kv_const*,std::vector<gguf_kv,std::allocator<gguf_kv>>>::
    __normal_iterator<gguf_kv*>
              (this,(__normal_iterator<gguf_kv_*,_std::vector<gguf_kv,_std::allocator<gguf_kv>_>_> *
                    )in_stack_ffffffffffffffb8);
    std::vector<gguf_kv,_std::allocator<gguf_kv>_>::erase
              ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)this_00._M_current,
               (const_iterator)__position._M_current);
  }
  return iVar1;
}

Assistant:

int64_t gguf_remove_key(struct gguf_context * ctx, const char * key) {
    const int64_t key_id = gguf_find_key(ctx, key);
    if (key_id >= 0) {
        ctx->kv.erase(ctx->kv.begin() + key_id);
    }
    return key_id;
}